

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O3

void __thiscall
QtPromisePrivate::PromiseData<QSharedPointer<Data>>::resolve<QSharedPointer<Data>>
          (PromiseData<QSharedPointer<Data>> *this,QSharedPointer<Data> *value)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Data *pDVar1;
  undefined8 *puVar2;
  QSharedPointer<Data> *__tmp;
  
  puVar2 = (undefined8 *)operator_new(0x20);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_0011ac00;
  pDVar1 = value->d;
  puVar2[2] = value->value;
  puVar2[3] = pDVar1;
  value->value = (Type *)0x0;
  value->d = (Data *)0x0;
  *(undefined8 **)(this + 0x58) = puVar2 + 2;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x60);
  *(undefined8 **)(this + 0x60) = puVar2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  PromiseDataBase<QSharedPointer<Data>,_void_(const_QSharedPointer<Data>_&)>::setSettled
            ((PromiseDataBase<QSharedPointer<Data>,_void_(const_QSharedPointer<Data>_&)> *)this);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }